

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O3

void __thiscall Fl_Table::col_width(Fl_Table *this,int col,int width)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int *__ptr;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  if (-1 < col) {
    uVar2 = (this->_colwidths)._size;
    lVar8 = (long)(int)uVar2;
    uVar9 = (ulong)(uint)col;
    if (col < (int)uVar2) {
      __ptr = (this->_colwidths).arr;
      if (__ptr[uVar9] == width) {
        return;
      }
    }
    else {
      uVar1 = col + 1;
      __ptr = (this->_colwidths).arr;
      if (uVar2 != uVar1) {
        __ptr = (int *)realloc(__ptr,(ulong)uVar1 << 2);
        (this->_colwidths).arr = __ptr;
        (this->_colwidths)._size = uVar1;
      }
      auVar5 = _DAT_00210030;
      auVar4 = _DAT_00210020;
      auVar3 = _DAT_00210010;
      if ((int)uVar2 < col) {
        lVar6 = (uVar9 - lVar8) + -1;
        auVar10._8_4_ = (int)lVar6;
        auVar10._0_8_ = lVar6;
        auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
        uVar7 = 0;
        auVar10 = auVar10 ^ _DAT_00210030;
        do {
          auVar12._8_4_ = (int)uVar7;
          auVar12._0_8_ = uVar7;
          auVar12._12_4_ = (int)(uVar7 >> 0x20);
          auVar13 = (auVar12 | auVar4) ^ auVar5;
          iVar11 = auVar10._4_4_;
          if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                      iVar11 < auVar13._4_4_) & 1)) {
            __ptr[lVar8 + uVar7] = width;
          }
          if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
              auVar13._12_4_ <= auVar10._12_4_) {
            __ptr[lVar8 + uVar7 + 1] = width;
          }
          auVar12 = (auVar12 | auVar3) ^ auVar5;
          iVar14 = auVar12._4_4_;
          if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar12._0_4_ <= auVar10._0_4_)) {
            __ptr[lVar8 + uVar7 + 2] = width;
            __ptr[lVar8 + uVar7 + 3] = width;
          }
          uVar7 = uVar7 + 4;
        } while (((uVar9 - lVar8) + 3 & 0xfffffffffffffffc) != uVar7);
      }
    }
    __ptr[uVar9] = width;
    table_resized(this);
    if (col <= this->rightcol) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    if (((this->super_Fl_Group).super_Fl_Widget.callback_ != (Fl_Callback *)0x0) &&
       (((this->super_Fl_Group).super_Fl_Widget.when_ & 1) != 0)) {
      this->_callback_context = CONTEXT_RC_RESIZE;
      this->_callback_row = 0;
      this->_callback_col = col;
      Fl_Widget::do_callback
                ((Fl_Widget *)this,(Fl_Widget *)this,
                 (this->super_Fl_Group).super_Fl_Widget.user_data_);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Table::col_width(int col, int width)
{
  if ( col < 0 ) return;
  if ( col < (int)_colwidths.size() && _colwidths[col] == width ) {
    return;			// OPTIMIZATION: no change? avoid redraw
  }
  // Add column widths, even if none yet
  int now_size = (int)_colwidths.size();
  if ( col >= now_size ) {
    _colwidths.size(col+1);
    while (now_size < col) {
      _colwidths[now_size++] = width;
    }
  }
  _colwidths[col] = width;
  table_resized();
  if ( col <= rightcol ) {	// OPTIMIZATION: only redraw if onscreen or to the left
    redraw();
  }
  // COLUMN RESIZE CALLBACK
  if ( Fl_Widget::callback() && when() & FL_WHEN_CHANGED ) {
    do_callback(CONTEXT_RC_RESIZE, 0, col);
  }
}